

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

pair<ska::detailv3::sherwood_v3_table<const_char_*,_const_char_*,_slang::Hasher<const_char_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_char_*>_>,_std::equal_to<const_char_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_char_*>_>,_std::allocator<const_char_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_char_*>_>_>::templated_iterator<const_char_*>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<char_const*,char_const*,slang::Hasher<char_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<char_const*>>,std::equal_to<char_const*>,ska::detailv3::functor_storage<bool,std::equal_to<char_const*>>,std::allocator<char_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<char_const*>>>
::emplace_new_key<char_const*>
          (sherwood_v3_table<char_const*,char_const*,slang::Hasher<char_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<char_const*>>,std::equal_to<char_const*>,ska::detailv3::functor_storage<bool,std::equal_to<char_const*>>,std::allocator<char_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<char_const*>>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,char **key)

{
  char *pcVar1;
  anon_union_8_1_a8c68091_for_sherwood_v3_entry<const_char_*>_3 aVar2;
  anon_union_8_1_a8c68091_for_sherwood_v3_entry<const_char_*>_3 in_RAX;
  long lVar3;
  anon_union_8_1_a8c68091_for_sherwood_v3_entry<const_char_*>_3 aVar4;
  long lVar5;
  EntryPointer psVar6;
  EntryPointer psVar7;
  sherwood_v3_table<char_const*,char_const*,slang::Hasher<char_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<char_const*>>,std::equal_to<char_const*>,ska::detailv3::functor_storage<bool,std::equal_to<char_const*>>,std::allocator<char_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<char_const*>>>
  sVar8;
  char __tmp_3;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  pair<ska::detailv3::sherwood_v3_table<const_char_*,_const_char_*,_slang::Hasher<const_char_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_char_*>_>,_std::equal_to<const_char_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_char_*>_>,_std::allocator<const_char_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_char_*>_>_>::templated_iterator<const_char_*>,_bool>
  pVar12;
  anon_union_8_1_a8c68091_for_sherwood_v3_entry<const_char_*>_3 local_18;
  char cVar9;
  
  local_18 = in_RAX;
  if ((*(long *)(this + 8) != 0) &&
     (this[0x11] !=
      (sherwood_v3_table<char_const*,char_const*,slang::Hasher<char_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<char_const*>>,std::equal_to<char_const*>,ska::detailv3::functor_storage<bool,std::equal_to<char_const*>>,std::allocator<char_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<char_const*>>>
       )distance_from_desired)) {
    lVar3 = *(long *)(this + 0x18) + 1;
    auVar10._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar10._0_8_ = lVar3;
    auVar10._12_4_ = 0x45300000;
    lVar5 = *(long *)(this + 8) + 1;
    auVar11._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar11._0_8_ = lVar5;
    auVar11._12_4_ = 0x45300000;
    if ((auVar10._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x14) *
        ((auVar11._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0))) {
      cVar9 = current_entry->distance_from_desired;
      if (cVar9 < '\0') {
        psVar7 = (EntryPointer)*key;
        (current_entry->field_1).value = (char *)psVar7;
        current_entry->distance_from_desired = distance_from_desired;
        *(long *)(this + 0x18) = lVar3;
LAB_0018711a:
        pVar12._9_7_ = (int7)((ulong)psVar7 >> 8);
        pVar12.second = true;
        pVar12.first.current = current_entry;
        return pVar12;
      }
      pcVar1 = *key;
      current_entry->distance_from_desired = distance_from_desired;
      aVar4 = current_entry->field_1;
      (current_entry->field_1).value = pcVar1;
      psVar7 = current_entry;
      do {
        sVar8 = (sherwood_v3_table<char_const*,char_const*,slang::Hasher<char_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<char_const*>>,std::equal_to<char_const*>,ska::detailv3::functor_storage<bool,std::equal_to<char_const*>>,std::allocator<char_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<char_const*>>>
                 )(cVar9 + '\x01');
        psVar6 = psVar7;
        while( true ) {
          psVar7 = psVar6 + 1;
          cVar9 = psVar7->distance_from_desired;
          if (cVar9 < '\0') {
            psVar6[1].field_1 = aVar4;
            psVar7->distance_from_desired = (int8_t)sVar8;
            *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
            goto LAB_0018711a;
          }
          if (cVar9 < (char)sVar8) break;
          sVar8 = (sherwood_v3_table<char_const*,char_const*,slang::Hasher<char_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<char_const*>>,std::equal_to<char_const*>,ska::detailv3::functor_storage<bool,std::equal_to<char_const*>>,std::allocator<char_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<char_const*>>>
                   )((char)sVar8 + '\x01');
          psVar6 = psVar7;
          if (this[0x11] == sVar8) {
            local_18 = current_entry->field_1;
            current_entry->field_1 = aVar4;
            key = (char **)&local_18;
            goto LAB_0018712c;
          }
        }
        psVar7->distance_from_desired = (int8_t)sVar8;
        aVar2 = psVar6[1].field_1;
        psVar6[1].field_1 = aVar4;
        aVar4 = aVar2;
      } while( true );
    }
  }
LAB_0018712c:
  sherwood_v3_table<const_char_*,_const_char_*,_slang::Hasher<const_char_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_char_*>_>,_std::equal_to<const_char_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_char_*>_>,_std::allocator<const_char_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_char_*>_>_>
  ::grow((sherwood_v3_table<const_char_*,_const_char_*,_slang::Hasher<const_char_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_char_*>_>,_std::equal_to<const_char_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_char_*>_>,_std::allocator<const_char_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_char_*>_>_>
          *)this);
  pVar12 = emplace<char_const*>(this,key);
  return pVar12;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }